

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::visitArrayNew<wasm::ArrayNewElem>
          (FunctionValidator *this,ArrayNewElem *curr)

{
  ulong uVar1;
  bool bVar2;
  HeapType local_28;
  HeapType heapType;
  
  shouldBeTrue<wasm::ArrayNewElem*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.new_{data, elem} requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewElem*,wasm::Type>
            (this,(Type)(curr->offset->type).id,(Type)0x2,curr,
             "array.new_{data, elem} offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewElem*,wasm::Type>
            (this,(Type)(curr->size->type).id,(Type)0x2,curr,
             "array.new_{data, elem} size must be an i32");
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id;
  if (uVar1 != 1) {
    bVar2 = shouldBeTrue<wasm::ArrayNewElem*>
                      (this,(uVar1 & 1) == 0 && 6 < uVar1,curr,
                       "array.new_{data, elem} type should be an array reference");
    if (bVar2) {
      local_28 = wasm::Type::getHeapType
                           (&(curr->super_SpecificExpression<(wasm::Expression::Id)72>).
                             super_Expression.type);
      bVar2 = HeapType::isArray(&local_28);
      shouldBeTrue<wasm::ArrayNewElem*>
                (this,bVar2,curr,"array.new_{data, elem} type should be an array reference");
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNew(ArrayNew* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.new_{data, elem} requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->offset->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->type.isRef(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
}